

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTestsPropertiesCommand.cxx
# Opt level: O2

bool cmSetTestsPropertiesCommand::SetOneTest
               (string *tname,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *propertyPairs,cmMakefile *mf,string *errors)

{
  pointer pbVar1;
  cmTest *this;
  ulong uVar2;
  uint uVar3;
  
  this = cmMakefile::GetTest(mf,tname);
  if (this == (cmTest *)0x0) {
    std::__cxx11::string::assign((char *)errors);
    std::__cxx11::string::append((string *)errors);
  }
  else {
    uVar3 = 1;
    while( true ) {
      uVar2 = (ulong)(uVar3 - 1);
      pbVar1 = (propertyPairs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(propertyPairs->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar2)
      break;
      if (pbVar1[uVar2]._M_string_length != 0) {
        cmTest::SetProperty(this,pbVar1 + uVar2,pbVar1[uVar3]._M_dataplus._M_p);
      }
      uVar3 = uVar3 + 2;
    }
  }
  return this != (cmTest *)0x0;
}

Assistant:

bool cmSetTestsPropertiesCommand
::SetOneTest(const std::string& tname,
             std::vector<std::string> &propertyPairs,
             cmMakefile *mf, std::string &errors)
{
  if(cmTest* test = mf->GetTest(tname))
    {
    // now loop through all the props and set them
    unsigned int k;
    for (k = 0; k < propertyPairs.size(); k = k + 2)
      {
      if (!propertyPairs[k].empty())
        {
        test->SetProperty(propertyPairs[k], propertyPairs[k+1].c_str());
        }
      }
    }
  else
    {
    errors = "Can not find test to add properties to: ";
    errors += tname;
    return false;
    }

  return true;
}